

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_reset(stCoRoutine_t *co)

{
  stCoRoutine_t *co_local;
  
  if ((co->cStart != '\0') && (co->cIsMain == '\0')) {
    co->cStart = '\0';
    co->cEnd = '\0';
    if (co->save_buffer != (char *)0x0) {
      free(co->save_buffer);
      co->save_buffer = (char *)0x0;
      co->save_size = 0;
    }
    if (co->stack_mem->occupy_co == co) {
      co->stack_mem->occupy_co = (stCoRoutine_t *)0x0;
    }
  }
  return;
}

Assistant:

void co_reset(stCoRoutine_t * co)
{
    if(!co->cStart || co->cIsMain)
        return;

    co->cStart = 0;
    co->cEnd = 0;

    // 如果当前协程有共享栈被切出的buff，要进行释放
    if(co->save_buffer)
    {
        free(co->save_buffer);
        co->save_buffer = NULL;
        co->save_size = 0;
    }

    // 如果共享栈被当前协程占用，要释放占用标志，否则被切换，会执行save_stack_buffer()
    if(co->stack_mem->occupy_co == co)
        co->stack_mem->occupy_co = NULL;
}